

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

MXFReader * __thiscall
AS_02::ACES::MXFReader::ReadFrame
          (MXFReader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  h__Reader *phVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  ui32_t FrameNum_local;
  MXFReader *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,FrameNum);
  phVar1 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)(lVar3 + 8));
  if (phVar1 != (h__Reader *)0x0) {
    phVar1 = ASDCP::mem_ptr<AS_02::ACES::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::ACES::MXFReader::h__Reader> *)(lVar3 + 8));
    uVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if ((uVar2 & 1) != 0) {
      phVar1 = ASDCP::mem_ptr<AS_02::ACES::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::ACES::MXFReader::h__Reader> *)(lVar3 + 8));
      h__Reader::ReadFrame
                ((h__Reader *)this,(ui32_t)phVar1,(FrameBuffer *)((ulong)FrameBuf & 0xffffffff),Ctx,
                 HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::ReadFrame(ui32_t FrameNum, AS_02::ACES::FrameBuffer &FrameBuf, ASDCP::AESDecContext *Ctx /*= 0*/, ASDCP::HMACContext *HMAC /*= 0*/) const
{

  if(m_Reader && m_Reader->m_File->IsOpen())
    return m_Reader->ReadFrame(FrameNum, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}